

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_NodeStore_replace(UA_NodeStore *ns,UA_Node *node)

{
  UA_NodeStoreEntry **ppUVar1;
  UA_ReferenceNode **entry_00;
  UA_NodeStoreEntry *newEntry;
  UA_NodeStoreEntry **entry;
  UA_Node *node_local;
  UA_NodeStore *ns_local;
  
  ppUVar1 = findNode(ns,&node->nodeId);
  if (ppUVar1 == (UA_NodeStoreEntry **)0x0) {
    ns_local._4_4_ = 0x80340000;
  }
  else {
    entry_00 = &node[-1].references;
    if (*ppUVar1 == (UA_NodeStoreEntry *)*entry_00) {
      deleteEntry(*ppUVar1);
      *ppUVar1 = (UA_NodeStoreEntry *)entry_00;
      ns_local._4_4_ = 0;
    }
    else {
      deleteEntry((UA_NodeStoreEntry *)entry_00);
      ns_local._4_4_ = 0x80020000;
    }
  }
  return ns_local._4_4_;
}

Assistant:

UA_StatusCode
UA_NodeStore_replace(UA_NodeStore *ns, UA_Node *node) {
    UA_NodeStoreEntry **entry = findNode(ns, &node->nodeId);
    if(!entry)
        return UA_STATUSCODE_BADNODEIDUNKNOWN;
    UA_NodeStoreEntry *newEntry = container_of(node, UA_NodeStoreEntry, node);
    if(*entry != newEntry->orig) {
        // the node was replaced since the copy was made
        deleteEntry(newEntry);
        return UA_STATUSCODE_BADINTERNALERROR;
    }
    deleteEntry(*entry);
    *entry = newEntry;
    return UA_STATUSCODE_GOOD;
}